

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

void __thiscall Fad<long_double>::Fad(Fad<long_double> *this,int sz,int i,longdouble *x)

{
  longdouble *plVar1;
  longdouble *plVar2;
  
  this->val_ = *x;
  (this->dx_).ptr_to_data = (longdouble *)0x0;
  (this->dx_).num_elts = sz;
  plVar1 = (longdouble *)operator_new__((ulong)(uint)sz * 0x10);
  (this->dx_).ptr_to_data = plVar1;
  plVar2 = plVar1 + (uint)sz;
  do {
    plVar2[-1] = (longdouble)0;
    plVar2 = plVar2 + -1;
  } while (plVar1 < plVar2);
  this->defaultVal = (longdouble)0;
  plVar1[i] = (longdouble)1;
  return;
}

Assistant:

Fad(const int sz, const int i, const T & x) : val_(x), dx_(sz,T(0)), defaultVal(T(0))
    {dx_[i]=1.;}